

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_MapFieldFeaturesInheritedMessageEncoding_Test::
~FeaturesTest_MapFieldFeaturesInheritedMessageEncoding_Test
          (FeaturesTest_MapFieldFeaturesInheritedMessageEncoding_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest((ValidationErrorTest *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, MapFieldFeaturesInheritedMessageEncoding) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = ParseAndBuildFile("foo.proto", R"schema(
    edition = "2023";

    option features.message_encoding = DELIMITED;

    message Foo {
      map<int32, Foo> message_map = 1;
      map<string, string> string_map = 2;
    }
  )schema");
  ASSERT_THAT(file, NotNull());

  const FieldDescriptor* message_map = file->message_type(0)->field(0);
  EXPECT_EQ(message_map->type(), FieldDescriptor::TYPE_MESSAGE);
  EXPECT_EQ(message_map->message_type()->field(0)->type(),
            FieldDescriptor::TYPE_INT32);
  EXPECT_EQ(message_map->message_type()->field(1)->type(),
            FieldDescriptor::TYPE_MESSAGE);

  const FieldDescriptor* string_map = file->message_type(0)->field(1);
  EXPECT_EQ(string_map->type(), FieldDescriptor::TYPE_MESSAGE);
  EXPECT_EQ(string_map->message_type()->field(0)->type(),
            FieldDescriptor::TYPE_STRING);
  EXPECT_EQ(string_map->message_type()->field(1)->type(),
            FieldDescriptor::TYPE_STRING);
}